

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageIntegrationTests.cpp
# Opt level: O0

int testStorageIntegrationTestsReadDataWithIncorrectType(void)

{
  initializer_list<unsigned_char> __l;
  string *psVar1;
  ostream *poVar2;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  runtime_error *ex;
  undefined1 local_c0 [7];
  bool caughtCorrectException;
  StorageReader local_a0;
  StorageReader reader;
  StorageWriter local_88;
  StorageWriter writer;
  uint64_t offset;
  allocator<unsigned_char> local_66;
  uchar local_65 [5];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_65[0] = '\x02';
  local_65[1] = 0;
  local_65[2] = 0x40;
  local_65[3] = 0;
  local_65[4] = 7;
  local_60 = local_65;
  local_58 = 5;
  std::allocator<unsigned_char>::allocator(&local_66);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,__l,&local_66);
  std::allocator<unsigned_char>::~allocator(&local_66);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  MILBlob::Blob::StorageWriter::StorageWriter(&local_88,psVar1,true);
  data_00 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  reader.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
        )data_00.m_ptr;
  writer.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        )MILBlob::Blob::StorageWriter::WriteData<unsigned_char>(&local_88,data_00);
  MILBlob::Blob::StorageWriter::~StorageWriter(&local_88);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_c0,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&local_a0,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  MILBlob::Blob::StorageReader::GetDataView<float>
            (&local_a0,
             (uint64_t)
             writer.m_impl._M_t.
             super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
             .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageIntegrationTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x54);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int testStorageIntegrationTestsReadDataWithIncorrectType()
{
    AutoDeleteTempFile tempfile;

    const std::vector<uint8_t> data = {0x02, 0x00, 0x40, 0x00, 0x07};
    uint64_t offset;
    {
        StorageWriter writer(tempfile.GetFilename());
        offset = writer.WriteData(Util::MakeSpan(data));
    }

    StorageReader reader(tempfile.GetFilename());
    {
        ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(offset),
                                      std::runtime_error,
                                      "Metadata data type does not match requested type.");
    }

    return 0;
}